

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall
Js::FunctionBody::GetMatchingStatementMap
          (FunctionBody *this,StatementData *data,int statementIndex,FunctionBody *inlinee)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  StatementMapList *this_00;
  Type *pTVar6;
  StatementMap *pSVar7;
  StatementMapList *pStatementMaps;
  SmallSpanSequenceIter iter;
  SmallSpanSequence *pSpanSequence;
  SourceInfo *si;
  FunctionBody *inlinee_local;
  int statementIndex_local;
  StatementData *data_local;
  FunctionBody *this_local;
  
  pSpanSequence = (SmallSpanSequence *)&this->m_sourceInfo;
  if ((inlinee != (FunctionBody *)0x0) &&
     (pSpanSequence = (SmallSpanSequence *)&inlinee->m_sourceInfo,
     (Type *)pSpanSequence == (Type *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xd5a,"(si)","si");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (-1 < statementIndex) {
    iter._8_8_ = pSpanSequence->pStatementBuffer;
    if ((GrowingUint32HeapArray *)iter._8_8_ == (GrowingUint32HeapArray *)0x0) {
      this_00 = GetStatementMaps(this);
      if (this_00 == (StatementMapList *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xd6d,"(pStatementMaps)","pStatementMaps");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      iVar4 = JsUtil::
              ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
              Count(&this_00->
                     super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                   );
      if (iVar4 <= statementIndex) {
        return 0;
      }
      pTVar6 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,statementIndex);
      pSVar7 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar6);
      data->sourceBegin = (pSVar7->sourceSpan).begin;
      pTVar6 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,statementIndex);
      pSVar7 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar6);
      data->bytecodeBegin = (pSVar7->byteCodeSpan).begin;
      return 1;
    }
    SmallSpanSequenceIter::SmallSpanSequenceIter((SmallSpanSequenceIter *)&pStatementMaps);
    SmallSpanSequence::Reset
              ((SmallSpanSequence *)iter._8_8_,(SmallSpanSequenceIter *)&pStatementMaps);
    BVar3 = SmallSpanSequence::Item
                      ((SmallSpanSequence *)iter._8_8_,statementIndex,
                       (SmallSpanSequenceIter *)&pStatementMaps,data);
    if (BVar3 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL FunctionBody::GetMatchingStatementMap(StatementData &data, int statementIndex, FunctionBody *inlinee)
    {
        SourceInfo *si = &this->m_sourceInfo;
        if (inlinee)
        {
            si = &inlinee->m_sourceInfo;
            Assert(si);
        }

        if (statementIndex >= 0)
        {
            SmallSpanSequence *pSpanSequence = si->pSpanSequence;
            if (pSpanSequence)
            {
                SmallSpanSequenceIter iter;
                pSpanSequence->Reset(iter);

                if (pSpanSequence->Item(statementIndex, iter, data))
                {
                    return TRUE;
                }
            }
            else
            {
                StatementMapList* pStatementMaps = GetStatementMaps();
                Assert(pStatementMaps);
                if (statementIndex >= pStatementMaps->Count())
                {
                    return FALSE;
                }

                data.sourceBegin = pStatementMaps->Item(statementIndex)->sourceSpan.begin;
                data.bytecodeBegin = pStatementMaps->Item(statementIndex)->byteCodeSpan.begin;
                return TRUE;
            }
        }

        return FALSE;
    }